

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_crld.cc
# Opt level: O2

int set_reasons(ASN1_BIT_STRING **preas,char *value)

{
  char *__s2;
  ulong uVar1;
  int iVar2;
  OPENSSL_STACK *sk;
  size_t sVar3;
  void *pvVar4;
  ASN1_BIT_STRING *a;
  ulong i;
  char **ppcVar5;
  uint uVar6;
  
  if (*preas == (ASN1_BIT_STRING *)0x0) {
    sk = (OPENSSL_STACK *)X509V3_parse_list(value);
    if (sk == (OPENSSL_STACK *)0x0) {
      uVar6 = 0;
    }
    else {
      uVar1 = 0;
      while( true ) {
        i = uVar1;
        sVar3 = OPENSSL_sk_num(sk);
        if (sVar3 <= i) break;
        pvVar4 = OPENSSL_sk_value(sk,i);
        __s2 = *(char **)((long)pvVar4 + 8);
        a = (ASN1_BIT_STRING *)*preas;
        if (a == (ASN1_BIT_STRING *)0x0) {
          a = ASN1_BIT_STRING_new();
          *preas = (ASN1_BIT_STRING *)a;
          if (a == (ASN1_BIT_STRING *)0x0) break;
        }
        ppcVar5 = &reason_flags[0].sname;
        while( true ) {
          if (ppcVar5[-1] == (char *)0x0) {
            uVar6 = 0;
            goto LAB_00205406;
          }
          iVar2 = strcmp(*ppcVar5,__s2);
          if (iVar2 == 0) break;
          ppcVar5 = ppcVar5 + 3;
        }
        iVar2 = ASN1_BIT_STRING_set_bit(a,((BIT_STRING_BITNAME *)(ppcVar5 + -2))->bitnum,1);
        uVar1 = i + 1;
        if (iVar2 == 0) break;
      }
      uVar6 = (uint)(sVar3 <= i);
LAB_00205406:
      sk_CONF_VALUE_pop_free((stack_st_CONF_VALUE *)sk,X509V3_conf_free);
    }
  }
  else {
    uVar6 = 0;
    ERR_put_error(0x14,0,0xa3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_crld.cc"
                  ,0xb3);
  }
  return uVar6;
}

Assistant:

static int set_reasons(ASN1_BIT_STRING **preas, const char *value) {
  if (*preas) {
    // Duplicate "reasons" or "onlysomereasons" key.
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_VALUE);
    return 0;
  }
  int ret = 0;
  STACK_OF(CONF_VALUE) *rsk = X509V3_parse_list(value);
  if (!rsk) {
    return 0;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(rsk); i++) {
    const char *bnam = sk_CONF_VALUE_value(rsk, i)->name;
    if (!*preas) {
      *preas = ASN1_BIT_STRING_new();
      if (!*preas) {
        goto err;
      }
    }
    const BIT_STRING_BITNAME *pbn;
    for (pbn = reason_flags; pbn->lname; pbn++) {
      if (!strcmp(pbn->sname, bnam)) {
        if (!ASN1_BIT_STRING_set_bit(*preas, pbn->bitnum, 1)) {
          goto err;
        }
        break;
      }
    }
    if (!pbn->lname) {
      goto err;
    }
  }
  ret = 1;

err:
  sk_CONF_VALUE_pop_free(rsk, X509V3_conf_free);
  return ret;
}